

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O3

void __thiscall
unitStringDefinitions_customaryVector_Test::TestBody
          (unitStringDefinitions_customaryVector_Test *this)

{
  long *plVar1;
  char *in_R9;
  long lVar2;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  
  plVar1 = &units::defined_unit_strings_customary;
  lVar2 = 0;
  while( true ) {
    local_48[0] = (internal)(*plVar1 != 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (*plVar1 == 0) break;
    lVar2 = lVar2 + 1;
    plVar1 = plVar1 + 3;
    if (lVar2 == 0x49d) {
      return;
    }
  }
  testing::Message::Message((Message *)&local_50);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_50._M_head_impl + 0x10));
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_38,local_48,
             (AssertionResult *)"units::defined_unit_strings_customary[ii].first != nullptr","false"
             ,"true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_defined_units.cpp"
             ,0x1c,local_38._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40,local_40);
  return;
}

Assistant:

TEST(unitStringDefinitions, customaryVector)
{
    for (std::size_t ii = 0; ii < units::defined_unit_strings_customary.size();
         ++ii) {
        EXPECT_TRUE(units::defined_unit_strings_customary[ii].first != nullptr)
            << ii;
        if (units::defined_unit_strings_customary[ii].first == nullptr) {
            break;
        }
    }
}